

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialMotionVector.cpp
# Opt level: O3

SpatialForceVector * __thiscall
iDynTree::SpatialMotionVector::cross
          (SpatialForceVector *__return_storage_ptr__,SpatialMotionVector *this,
          SpatialForceVector *other)

{
  AngularVector3T *this_00;
  double local_70;
  double dStack_68;
  double local_60;
  GeomVector3 local_58;
  GeomVector3 local_40;
  
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[1] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[1] = 0.0;
  __return_storage_ptr__->_vptr_SpatialForceVector = (_func_int **)&PTR__SpatialForceVector_0015ec98
  ;
  this_00 = &(this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3;
  GeomVector3::cross(this_00,&(other->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3)
  ;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[2] = local_60;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[0] = local_70;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[1] = dStack_68;
  GeomVector3::cross((GeomVector3 *)this,
                     &(other->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3);
  GeomVector3::cross(this_00,&(other->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3
                    );
  GeomVector3::operator+(&local_40,&local_58);
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[2] = local_60;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[0] = local_70;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[1] = dStack_68;
  return __return_storage_ptr__;
}

Assistant:

SpatialForceVector SpatialMotionVector::cross(const SpatialForceVector& other) const
{
    SpatialForceVector res;

    res.getLinearVec3()  = this->angularVec3.cross(other.getLinearVec3());
    res.getAngularVec3() = this->linearVec3.cross(other.getLinearVec3()) + this->angularVec3.cross(other.getAngularVec3());

    return res;
}